

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDataStream.cpp
# Opt level: O0

KString * __thiscall
KDIS::KDataStream::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,KDataStream *this)

{
  bool bVar1;
  byte *pbVar2;
  ostream *poVar3;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1b0;
  const_iterator citrEnd;
  const_iterator citr;
  KStringStream ss;
  ostream local_190 [376];
  KDataStream *local_18;
  KDataStream *this_local;
  
  local_18 = this;
  this_local = (KDataStream *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&citr);
  citrEnd = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&this->m_vBuffer);
  local_1b0._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&this->m_vBuffer);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_1b0);
    if (!bVar1) break;
    pbVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&citrEnd);
    if (*pbVar2 < 10) {
      std::operator<<(local_190,"0");
    }
    poVar3 = (ostream *)std::ostream::operator<<(local_190,std::hex);
    pbVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&citrEnd);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)*pbVar2);
    std::operator<<(poVar3," ");
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++(&citrEnd);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&citr);
  return __return_storage_ptr__;
}

Assistant:

KString KDataStream::GetAsString() const
{
    KStringStream ss;

    auto citr = m_vBuffer.begin();
    auto citrEnd = m_vBuffer.end();

    for( ; citr != citrEnd; ++citr )
    {
        // If less than 10 add a zero so that each octet has the same 2 digit
        // representation.
        if( *citr < 10 )ss << "0";

        ss << hex << ( KUINT16 )*citr << " ";
    }

    return ss.str();
}